

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

bool __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::get(Branch *this,ExceptionOrValue *output)

{
  PromiseNode *pPVar1;
  
  pPVar1 = (this->dependency).ptr;
  if (pPVar1 != (PromiseNode *)0x0) {
    (*pPVar1->_vptr_PromiseNode[2])(pPVar1);
  }
  return pPVar1 != (PromiseNode *)0x0;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<Own<Task>>* ptr = &tasks;
  for (;;) {
    KJ_IF_MAYBE(task, *ptr) {
      traces.add(task->get()->trace());
      ptr = &task->get()->next;
    } else {
      break;
    }
  }